

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wm_abstract.h
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
rw::operator<<(basic_ostream<char,_std::char_traits<char>_> *stream,
              vector<rw::Window_*,_std::allocator<rw::Window_*>_> *v)

{
  pointer ppWVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"[",1);
  ppWVar1 = (v->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (ppWVar1 !=
      (v->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    operator<<(stream,*ppWVar1);
    ppWVar1 = ppWVar1 + 1;
    if (ppWVar1 !=
        (v->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(stream,",\n ",3);
        operator<<(stream,*ppWVar1);
        ppWVar1 = ppWVar1 + 1;
      } while (ppWVar1 !=
               (v->super__Vector_base<rw::Window_*,_std::allocator<rw::Window_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  return stream;
}

Assistant:

T &operator<<(T &stream, const vector<Window *> v) {
        stream << "[";
        auto i = v.begin();
        if (i != v.end()) {
            stream << *i;
            i++;
        }
        while (i != v.end()) {
            stream << ",\n " << *i;
            i++;
        }
        stream << "]";
        return stream;
    }